

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::to_string_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,uint64_t match_flags)

{
  uint32_t commodity;
  precise_unit un_00;
  string local_40;
  precise_unit *local_20;
  uint64_t match_flags_local;
  precise_unit *un_local;
  
  un_00._8_8_ = un;
  un_00.multiplier_ = *(double *)this;
  local_20 = un;
  match_flags_local = (uint64_t)this;
  un_local = (precise_unit *)__return_storage_ptr__;
  to_string_internal_abi_cxx11_(&local_40,*(units **)(this + 8),un_00,match_flags);
  commodity = precise_unit::commodity((precise_unit *)match_flags_local);
  clean_unit_string(__return_storage_ptr__,&local_40,commodity);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const precise_unit& un, std::uint64_t match_flags)
{
    return clean_unit_string(
        to_string_internal(un, match_flags), un.commodity());
}